

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

void tcg_region_bounds(TCGContext_conflict9 *tcg_ctx,size_t curr_region,void **pstart,void **pend)

{
  void *pvVar1;
  void *pvVar2;
  
  pvVar1 = (void *)((tcg_ctx->region).stride * curr_region + (long)(tcg_ctx->region).start_aligned);
  pvVar2 = pvVar1;
  if (curr_region == 0) {
    pvVar2 = (tcg_ctx->region).start;
  }
  if ((tcg_ctx->region).n - 1 == curr_region) {
    pvVar1 = (tcg_ctx->region).end;
  }
  else {
    pvVar1 = (void *)((long)pvVar1 + (tcg_ctx->region).size);
  }
  *pstart = pvVar2;
  *pend = pvVar1;
  return;
}

Assistant:

static void tcg_region_bounds(TCGContext *tcg_ctx, size_t curr_region, void **pstart, void **pend)
{
    char *start, *end;

    start = (char *)tcg_ctx->region.start_aligned + curr_region * tcg_ctx->region.stride;
    end = start + tcg_ctx->region.size;

    if (curr_region == 0) {
        start = tcg_ctx->region.start;
    }
    if (curr_region == tcg_ctx->region.n - 1) {
        end = tcg_ctx->region.end;
    }

    *pstart = start;
    *pend = end;
}